

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.h
# Opt level: O3

char * __thiscall cppcms::impl::cgi::connection::getenv_abi_cxx11_(connection *this,char *__name)

{
  char *__s;
  char *pcVar1;
  int iVar2;
  mapped_type *pmVar3;
  pointer peVar4;
  allocator local_51;
  key_type local_50;
  
  if (((this->map_env_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     (iVar2 = (this->env_).first_, iVar2 != -1)) {
    peVar4 = (this->env_).data_.
             super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __s = peVar4[iVar2].value;
      std::__cxx11::string::string((string *)&local_50,peVar4[iVar2].key,&local_51);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->map_env_,&local_50);
      pcVar1 = (char *)pmVar3->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,(ulong)__s);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      peVar4 = (this->env_).data_.
               super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = peVar4[iVar2].next_index;
    } while (iVar2 != -1);
  }
  return (char *)&this->map_env_;
}

Assistant:

virtual std::map<std::string,std::string> const &getenv()
		{
			if(map_env_.empty() && env_.begin()!=env_.end()) {
				for(string_map::iterator p=env_.begin();p!=env_.end();++p) {
					map_env_[p->key]=p->value;
				}
			}
			return map_env_;
		}